

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonPatchFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  JsonParse *pTarget;
  JsonParse *pPatch;
  
  pTarget = jsonParseFuncArg(ctx,*argv,1);
  if (pTarget != (JsonParse *)0x0) {
    pPatch = jsonParseFuncArg(ctx,argv[1],0);
    if (pPatch != (JsonParse *)0x0) {
      iVar1 = jsonMergePatch(pTarget,0,pPatch,0);
      if (iVar1 == 3) {
        sqlite3_result_error_nomem(ctx);
      }
      else if (iVar1 == 0) {
        jsonReturnParse(ctx,pTarget);
      }
      else {
        sqlite3_result_error(ctx,"malformed JSON",-1);
      }
      jsonParseFree(pPatch);
    }
    jsonParseFree(pTarget);
    return;
  }
  return;
}

Assistant:

static void jsonPatchFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *pTarget;    /* The TARGET */
  JsonParse *pPatch;     /* The PATCH */
  int rc;                /* Result code */

  UNUSED_PARAMETER(argc);
  assert( argc==2 );
  pTarget = jsonParseFuncArg(ctx, argv[0], JSON_EDITABLE);
  if( pTarget==0 ) return;
  pPatch = jsonParseFuncArg(ctx, argv[1], 0);
  if( pPatch ){
    rc = jsonMergePatch(pTarget, 0, pPatch, 0);
    if( rc==JSON_MERGE_OK ){
      jsonReturnParse(ctx, pTarget);
    }else if( rc==JSON_MERGE_OOM ){
      sqlite3_result_error_nomem(ctx);
    }else{
      sqlite3_result_error(ctx, "malformed JSON", -1);
    }
    jsonParseFree(pPatch);
  }
  jsonParseFree(pTarget);
}